

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<vec<int>>::vec<vec<int>>(vec<vec<int>_> *this,vec<vec<int>_> *other)

{
  uint uVar1;
  int *piVar2;
  vec<vec<int>_> *in_RSI;
  vec<int> *in_RDI;
  vec<int> *unaff_retaddr;
  uint i;
  uint local_14;
  vec<int> *other_00;
  
  other_00 = in_RDI;
  uVar1 = vec<vec<int>_>::size(in_RSI);
  in_RDI->sz = uVar1;
  in_RDI->cap = in_RDI->sz;
  piVar2 = (int *)malloc((ulong)in_RDI->cap << 4);
  in_RDI->data = piVar2;
  for (local_14 = 0; local_14 < in_RDI->sz; local_14 = local_14 + 1) {
    vec<vec<int>_>::operator[](in_RSI,local_14);
    vec<int>::vec<int>(unaff_retaddr,other_00);
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}